

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetRelErrFunc(void *kinmem,sunrealtype relfunc)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  sunrealtype uround;
  KINMem kin_mem;
  sunrealtype local_38;
  sunrealtype local_30;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x2c3,"KINSetRelErrFunc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      if (0.0 < in_XMM0_Qa) {
        local_38 = sqrt(in_XMM0_Qa);
      }
      else {
        local_38 = 0.0;
      }
      in_RDI->kin_sqrt_relfunc = local_38;
    }
    else {
      if (0.0 < in_RDI->kin_uround) {
        local_30 = sqrt(in_RDI->kin_uround);
      }
      else {
        local_30 = 0.0;
      }
      in_RDI->kin_sqrt_relfunc = local_30;
    }
    local_4 = 0;
  }
  else {
    KINProcessError(in_RDI,-2,0x2cb,"KINSetRelErrFunc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"relfunc < 0 illegal.");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetRelErrFunc(void* kinmem, sunrealtype relfunc)
{
  KINMem kin_mem;
  sunrealtype uround;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (relfunc < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELFUNC);
    return (KIN_ILL_INPUT);
  }

  if (relfunc == ZERO)
  {
    uround                    = kin_mem->kin_uround;
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(uround);
  }
  else { kin_mem->kin_sqrt_relfunc = SUNRsqrt(relfunc); }

  return (KIN_SUCCESS);
}